

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::TaskSet::add(TaskSet *this,Promise<void> *promise)

{
  Task *pTVar1;
  Maybe<kj::Own<kj::TaskSet::Task>_> *other;
  Own<kj::TaskSet::Task> task;
  Own<kj::TaskSet::Task> local_28;
  Own<kj::TaskSet::Task> local_18;
  
  heap<kj::TaskSet::Task,kj::TaskSet&,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_28,this,(Own<kj::_::PromiseNode> *)promise);
  pTVar1 = (this->tasks).ptr.ptr;
  other = &this->tasks;
  if (pTVar1 != (Task *)0x0) {
    pTVar1->prev = &(local_28.ptr)->next;
    Own<kj::TaskSet::Task>::operator=(&((local_28.ptr)->next).ptr,&other->ptr);
  }
  (local_28.ptr)->prev = other;
  local_18.disposer = local_28.disposer;
  local_18.ptr = local_28.ptr;
  local_28.ptr = (Task *)0x0;
  Own<kj::TaskSet::Task>::operator=(&other->ptr,&local_18);
  Own<kj::TaskSet::Task>::dispose(&local_18);
  Own<kj::TaskSet::Task>::dispose(&local_28);
  return;
}

Assistant:

void TaskSet::add(Promise<void>&& promise) {
  auto task = heap<Task>(*this, kj::mv(promise.node));
  KJ_IF_MAYBE(head, tasks) {
    head->get()->prev = &task->next;
    task->next = kj::mv(tasks);
  }
  task->prev = &tasks;
  tasks = kj::mv(task);
}